

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O3

bool __thiscall
__gnu_cxx::__ops::_Iter_less_iter::operator()
          (_Iter_less_iter *this,
          DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *__it1,
          DequeIterator<int,_int_&,_int_*,_Deque<int,_std::allocator<int>_>_> *__it2)

{
  Deque<int,_std::allocator<int>_> *pDVar1;
  DataBlock **ppDVar2;
  ulong uVar3;
  Deque<int,_std::allocator<int>_> *pDVar4;
  DataBlock **ppDVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  pDVar1 = __it1->deque_;
  ppDVar2 = (pDVar1->current_).begin_;
  uVar3 = (pDVar1->current_).allocSize_;
  uVar9 = ((long)(*ppDVar2)->begin - (long)(*ppDVar2)->buffer >> 2) + __it1->n_;
  uVar7 = uVar9 >> 8;
  pDVar4 = __it2->deque_;
  lVar10 = -uVar3;
  if ((ulong)((long)((long)ppDVar2 + (uVar7 * 8 - (long)(pDVar1->current_).arr_)) >> 3) < uVar3) {
    lVar10 = 0;
  }
  ppDVar5 = (pDVar4->current_).begin_;
  uVar3 = (pDVar4->current_).allocSize_;
  uVar11 = ((long)(*ppDVar5)->begin - (long)(*ppDVar5)->buffer >> 2) + __it2->n_;
  uVar6 = uVar11 >> 8;
  lVar8 = -uVar3;
  if ((ulong)((long)((long)ppDVar5 + (uVar6 * 8 - (long)(pDVar4->current_).arr_)) >> 3) < uVar3) {
    lVar8 = 0;
  }
  return ppDVar2[uVar7 + lVar10]->buffer[(uint)uVar9 & 0xff] <
         ppDVar5[uVar6 + lVar8]->buffer[(uint)uVar11 & 0xff];
}

Assistant:

RefType operator *() const {
            return deque_->at(n_);
        }